

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.hpp
# Opt level: O1

SampleInfo * __thiscall
Triangle::sampleSurface(SampleInfo *__return_storage_ptr__,Triangle *this,Sampler *sampler)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined8 extraout_XMM0_Qa;
  float fVar15;
  
  (*sampler->_vptr_Sampler[4])(sampler);
  fVar1 = (this->v2).z;
  fVar2 = (this->v1).z;
  fVar14 = (float)extraout_XMM0_Qa;
  fVar15 = (float)((ulong)extraout_XMM0_Qa >> 0x20);
  fVar3 = (this->v3).z;
  uVar6 = (this->v2).x;
  uVar9 = (this->v2).y;
  uVar7 = (this->v1).x;
  uVar10 = (this->v1).y;
  uVar8 = (this->v3).x;
  uVar11 = (this->v3).y;
  fVar12 = (this->planeNormal).x;
  fVar13 = (this->planeNormal).y;
  fVar4 = (this->planeNormal).z;
  fVar5 = this->one_by_2S;
  (__return_storage_ptr__->p).x =
       ((float)uVar8 - (float)uVar7) * fVar15 +
       fVar14 * ((float)uVar6 - (float)uVar7) + (float)uVar7;
  (__return_storage_ptr__->p).y =
       ((float)uVar11 - (float)uVar10) * fVar15 +
       fVar14 * ((float)uVar9 - (float)uVar10) + (float)uVar10;
  (__return_storage_ptr__->p).z = (fVar3 - fVar2) * fVar15 + (fVar1 - fVar2) * fVar14 + fVar2;
  (__return_storage_ptr__->normal).x = fVar12;
  (__return_storage_ptr__->normal).y = fVar13;
  (__return_storage_ptr__->normal).z = fVar4;
  __return_storage_ptr__->pdf = fVar5 + fVar5;
  return __return_storage_ptr__;
}

Assistant:

SampleInfo sampleSurface(Sampler& sampler) const
	{
		vec2f t = sampler.sampleUnitTriangle();
		vec3f p = v1 + t.x * (v2-v1) + t.y * (v3-v1);
		return SampleInfo(p, planeNormal, 2 * one_by_2S);
	}